

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

EmulatorEvent emulator_run_until(Emulator *e,Ticks until_ticks)

{
  EmulatorEvent *pEVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  Ticks TVar14;
  char temp [64];
  
  if (((e->state).event & 2) != 0) {
    (e->audio_buffer).position = (e->audio_buffer).data;
  }
  check_joyp_intr(e);
  (e->state).event = 0;
  uVar13 = (ulong)(e->audio_buffer).frequency;
  lVar7 = (long)(e->audio_buffer).position - (long)(e->audio_buffer).data;
  uVar6 = 0;
  uVar13 = ((((ulong)((e->audio_buffer).frames - (int)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1)) *
              0x400000 + uVar13) - 1) / uVar13 & 0xffffffff) + (e->state).apu.sync_ticks;
  TVar14 = until_ticks;
  if (uVar13 < until_ticks) {
    TVar14 = uVar13;
  }
  uVar4 = (e->state).ticks;
  while (uVar4 < TVar14) {
    if ((e->state).hdma.state == DMA_INACTIVE) {
      if ((s_profiling_counters[s_trace_stack_top + 0x7fffff] != 0) &&
         ((e->state).interrupt.state < CPU_STATE_HALT)) {
        uVar9 = 0x5a;
        if ((e->state).reg.F.Z == FALSE) {
          uVar9 = 0x2d;
        }
        uVar8 = 0x4e;
        if ((e->state).reg.F.N == FALSE) {
          uVar8 = 0x2d;
        }
        uVar11 = 0x48;
        if ((e->state).reg.F.H == FALSE) {
          uVar11 = 0x2d;
        }
        uVar12 = 0x43;
        if ((e->state).reg.F.C == FALSE) {
          uVar12 = 0x2d;
        }
        printf("A:%02X F:%c%c%c%c BC:%04X DE:%04x HL:%04x SP:%04x PC:%04x",(ulong)(e->state).reg.A,
               uVar9,uVar8,uVar11,uVar12,(ulong)(e->state).reg.field_1.BC,
               (ulong)(e->state).reg.field_2.DE,(ulong)(e->state).reg.field_3.HL,
               (ulong)(e->state).reg.SP,(ulong)(e->state).reg.PC);
        printf(" (cy: %lu)",(e->state).ticks);
        if (s_log_level[5] != LOG_LEVEL_QUIET) {
          printf(" ppu:%c%u",(ulong)((uint)((e->state).ppu.lcdc.display == FALSE) * 2 + 0x2b),
                 (ulong)(e->state).ppu.stat.mode);
        }
        if (LOG_LEVEL_INFO < s_log_level[5]) {
          printf(" LY:%u",(ulong)(e->state).ppu.ly);
        }
        printf(" |");
        emulator_disassemble(e,(e->state).reg.PC,temp,0x40);
        printf("%s");
        putchar(10);
      }
      if ((((s_breakpoint_count != 0) &&
           (uVar3 = (e->state).reg.PC, (s_breakpoint_mask_0 & uVar3) == 0)) &&
          ((s_breakpoint_mask_1 & uVar3) == s_breakpoint_mask_1)) &&
         (lVar7 = (long)s_breakpoint_max_id, 0 < lVar7)) {
        lVar10 = 0;
        bVar5 = false;
        do {
          bVar2 = s_breakpoints[lVar10].field_0x7;
          if ((((~bVar2 & 3) == 0) && (s_breakpoints[lVar10].addr == uVar3)) &&
             (((short)uVar3 < 0 ||
              ((e->state).memory_map_state.rom_base[uVar3 >> 0xe] >> 0xe ==
               (uint)s_breakpoints[lVar10].bank)))) {
            if ((bVar2 & 4) == 0) {
              bVar5 = true;
            }
            s_breakpoints[lVar10].field_0x7 = bVar2 ^ 4;
          }
          lVar10 = lVar10 + 1;
        } while (lVar7 != lVar10);
        if (bVar5) {
          pEVar1 = &(e->state).event;
          *(byte *)pEVar1 = (byte)*pEVar1 | 8;
          goto LAB_0018da8d;
        }
      }
      execute_instruction(e);
    }
    else {
      (e->state).interrupt.if_ = (e->state).interrupt.new_if;
      (e->state).ticks = uVar4 + (e->state).cpu_tick;
      hdma_copy_byte(e);
      hdma_copy_byte(e);
    }
LAB_0018da8d:
    uVar6 = (e->state).event;
    if (uVar6 != 0) break;
    uVar4 = (e->state).ticks;
  }
  uVar4 = (e->state).ticks;
  if (uVar13 <= uVar4) {
    (e->state).event = uVar6 | 2;
  }
  if (until_ticks <= uVar4) {
    pEVar1 = &(e->state).event;
    *(byte *)pEVar1 = (byte)*pEVar1 | 4;
  }
  apu_synchronize(e);
  return (e->state).event;
}

Assistant:

EmulatorEvent emulator_run_until(Emulator* e, Ticks until_ticks) {
  AudioBuffer* ab = &e->audio_buffer;
  if (e->state.event & EMULATOR_EVENT_AUDIO_BUFFER_FULL) {
    ab->position = ab->data;
  }
  check_joyp_intr(e);
  e->state.event = 0;

  u64 frames_left = ab->frames - audio_buffer_get_frames(ab);
  Ticks max_audio_ticks =
      APU.sync_ticks +
      (u32)DIV_CEIL(frames_left * CPU_TICKS_PER_SECOND, ab->frequency);
  Ticks check_ticks = MIN(until_ticks, max_audio_ticks);
  while (e->state.event == 0 && TICKS < check_ticks) {
    emulator_step_internal(e);
  }
  if (TICKS >= max_audio_ticks) {
    e->state.event |= EMULATOR_EVENT_AUDIO_BUFFER_FULL;
  }
  if (TICKS >= until_ticks) {
    e->state.event |= EMULATOR_EVENT_UNTIL_TICKS;
  }
  apu_synchronize(e);
  return e->state.event;
}